

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall
Js::FunctionBody::TryGetDebuggerScopeAt(FunctionBody *this,int index,DebuggerScope **debuggerScope)

{
  int iVar1;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00
  ;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DebuggerScope **ppDVar5;
  
  if ((this->m_sourceInfo).pScopeObjectChain.ptr == (ScopeObjectChain *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1efd,"(this->GetScopeObjectChain())",
                                "TryGetDebuggerScopeAt should only be called with a valid scope chain in place."
                               );
    if (!bVar3) goto LAB_0077c47c;
    *puVar4 = 0;
  }
  if (index < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1efe,"(index >= 0)","index >= 0");
    if (!bVar3) {
LAB_0077c47c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this_00 = (((this->m_sourceInfo).pScopeObjectChain.ptr)->pScopeChain).ptr;
  iVar1 = (this_00->super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).
          count;
  if (index < iVar1) {
    ppDVar5 = JsUtil::ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>::Item
                        (&this_00->
                          super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>
                         ,index);
    *debuggerScope = *ppDVar5;
  }
  return index < iVar1;
}

Assistant:

bool FunctionBody::TryGetDebuggerScopeAt(int index, DebuggerScope*& debuggerScope)
    {
        AssertMsg(this->GetScopeObjectChain(), "TryGetDebuggerScopeAt should only be called with a valid scope chain in place.");
        Assert(index >= 0);

        const Js::ScopeObjectChain::ScopeObjectChainList* scopeChain = this->GetScopeObjectChain()->pScopeChain;
        if (index < scopeChain->Count())
        {
            debuggerScope = scopeChain->Item(index);
            return true;
        }

        return false;
    }